

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cbegin
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  _Elt_pointer pfVar1;
  _Map_pointer ppfVar2;
  size_type sVar3;
  reference puVar4;
  _Self local_48;
  
  sVar3 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bounds);
  if (index < sVar3) {
    if (index == 0) {
      pfVar1 = (this->entries).
               super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
      __return_storage_ptr__->_M_cur =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      __return_storage_ptr__->_M_first = pfVar1;
      ppfVar2 = (this->entries).
                super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      __return_storage_ptr__->_M_last =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      __return_storage_ptr__->_M_node = ppfVar2;
    }
    else {
      local_48._M_cur =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
      local_48._M_first =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      local_48._M_last =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
      local_48._M_node =
           (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_node;
      puVar4 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                         (&(this->bounds).
                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                           super__Deque_impl_data._M_start,index - 1);
      std::operator+(__return_storage_ptr__,&local_48,*puVar4);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xaa,
                "typename std::deque<ValueType>::const_iterator compressed_sparse_matrix<filtration_entry_t>::cbegin(size_t) const [ValueType = filtration_entry_t]"
               );
}

Assistant:

typename std::deque<ValueType>::const_iterator cbegin(size_t index) const {
		assert(index < size());
		return index == 0 ? entries.cbegin() : entries.cbegin() + bounds[index - 1];
	}